

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

SPIRConstantOp * __thiscall
diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRConstantOp>::
allocate<unsigned_int&,spv::Op&,unsigned_int_const*,unsigned_int>
          (ObjectPool<diligent_spirv_cross::SPIRConstantOp> *this,uint *p,Op *p_1,uint **p_2,
          uint *p_3)

{
  uint uVar1;
  SPIRConstantOp *this_00;
  bool bVar2;
  size_t sVar3;
  SPIRConstantOp **ppSVar4;
  TypeID local_64;
  SPIRConstantOp *local_60;
  SPIRConstantOp *ptr;
  uint local_4c;
  SPIRConstantOp *pSStack_48;
  uint i;
  SPIRConstantOp *ptr_1;
  uint *puStack_38;
  uint num_objects;
  uint *p_local_3;
  uint **p_local_2;
  Op *p_local_1;
  uint *p_local;
  ObjectPool<diligent_spirv_cross::SPIRConstantOp> *this_local;
  
  puStack_38 = p_3;
  p_local_3 = (uint *)p_2;
  p_local_2 = (uint **)p_1;
  p_local_1 = p;
  p_local = (uint *)this;
  bVar2 = VectorView<diligent_spirv_cross::SPIRConstantOp_*>::empty
                    (&(this->vacants).super_VectorView<diligent_spirv_cross::SPIRConstantOp_*>);
  if (bVar2) {
    uVar1 = this->start_object_count;
    sVar3 = VectorView<std::unique_ptr<diligent_spirv_cross::SPIRConstantOp,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRConstantOp>::MallocDeleter>_>
            ::size(&(this->memory).
                    super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRConstantOp,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRConstantOp>::MallocDeleter>_>
                  );
    ptr_1._4_4_ = uVar1 << ((byte)sVar3 & 0x1f);
    pSStack_48 = (SPIRConstantOp *)malloc((ulong)ptr_1._4_4_ * 0x50);
    if (pSStack_48 == (SPIRConstantOp *)0x0) {
      return (SPIRConstantOp *)0x0;
    }
    SmallVector<diligent_spirv_cross::SPIRConstantOp_*,_0UL>::reserve
              (&this->vacants,(ulong)ptr_1._4_4_);
    for (local_4c = 0; local_4c < ptr_1._4_4_; local_4c = local_4c + 1) {
      ptr = pSStack_48 + local_4c;
      SmallVector<diligent_spirv_cross::SPIRConstantOp_*,_0UL>::push_back(&this->vacants,&ptr);
    }
    SmallVector<std::unique_ptr<diligent_spirv_cross::SPIRConstantOp,diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRConstantOp>::MallocDeleter>,8ul>
    ::emplace_back<diligent_spirv_cross::SPIRConstantOp*&>
              ((SmallVector<std::unique_ptr<diligent_spirv_cross::SPIRConstantOp,diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRConstantOp>::MallocDeleter>,8ul>
                *)&this->memory,&stack0xffffffffffffffb8);
  }
  ppSVar4 = VectorView<diligent_spirv_cross::SPIRConstantOp_*>::back
                      (&(this->vacants).super_VectorView<diligent_spirv_cross::SPIRConstantOp_*>);
  local_60 = *ppSVar4;
  SmallVector<diligent_spirv_cross::SPIRConstantOp_*,_0UL>::pop_back(&this->vacants);
  this_00 = local_60;
  TypedID<(diligent_spirv_cross::Types)1>::TypedID(&local_64,*p_local_1);
  SPIRConstantOp::SPIRConstantOp
            (this_00,local_64,*(Op *)p_local_2,*(uint32_t **)p_local_3,*puStack_38);
  return local_60;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}